

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

int __thiscall geemuboi::core::CPU::jr_nc_r8(CPU *this)

{
  Registers *pRVar1;
  int iVar2;
  
  pRVar1 = this->regs;
  if ((pRVar1->f & 0x10) == 0) {
    iVar2 = (**this->mmu->_vptr_IMmu)(this->mmu,(ulong)pRVar1->pc);
    this->regs->pc = (short)(char)iVar2 + this->regs->pc + 1;
    return 3;
  }
  pRVar1->pc = pRVar1->pc + 1;
  return 2;
}

Assistant:

int CPU::jr_nc_r8() {
    if (!(regs.f & 0x10)) {
        int offset = static_cast<int8_t>(mmu.read_byte(regs.pc)) + 2;
        regs.pc += offset - 1;
        return 3;
    } else {
        regs.pc += 1;
        return 2;
    }
}